

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  undefined8 *puVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ss;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  long *plVar5;
  ostream *poVar6;
  size_t sVar7;
  undefined8 *puVar8;
  undefined8 extraout_RAX;
  long *plVar9;
  ulong *puVar10;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  size_type *psVar12;
  ulong uVar13;
  undefined8 uVar14;
  uint uVar15;
  char flag;
  Message error;
  char buffer [256];
  byte local_221;
  string local_220;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0;
  long lStack_1c8;
  string local_1c0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  int local_17c;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  long *local_158 [2];
  long local_148 [2];
  string local_138 [8];
  
LAB_001884fd:
  sVar3 = read(this->read_fd_,&local_221,1);
  iVar2 = (int)sVar3;
  if (iVar2 == -1) goto code_r0x00188516;
  if (iVar2 == 0) {
    this->outcome_ = DIED;
    goto LAB_0018860e;
  }
  if (iVar2 == 1) {
    if (local_221 < 0x52) {
      if (local_221 == 0x49) {
        iVar2 = this->read_fd_;
        Message::Message((Message *)&local_1a0);
        ss.ptr_ = local_1a0.ptr_;
        poVar6 = (ostream *)(local_1a0.ptr_ + 0x10);
        do {
          while( true ) {
            sVar3 = read(iVar2,local_138,0xff);
            uVar15 = (uint)sVar3;
            if ((int)uVar15 < 1) break;
            *(undefined1 *)((long)&local_138[0]._M_dataplus._M_p + (ulong)(uVar15 & 0x7fffffff)) = 0
            ;
            sVar7 = strlen((char *)local_138);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_138,sVar7);
          }
        } while ((uVar15 == 0xffffffff) && (piVar4 = __errno_location(), *piVar4 == 4));
        if (uVar15 == 0) {
          GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/lib/gtest/googletest/src/gtest-death-test.cc"
                             ,0x150);
          StringStreamToString(&local_220,ss.ptr_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_220._M_dataplus._M_p,local_220._M_string_length);
        }
        else {
          piVar4 = __errno_location();
          iVar2 = *piVar4;
          GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/lib/gtest/googletest/src/gtest-death-test.cc"
                             ,0x153);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
          GetLastErrnoDescription_abi_cxx11_();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_220._M_dataplus._M_p,
                              local_220._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        GTestLog::~GTestLog((GTestLog *)&local_200);
        if (ss.ptr_ != (stringstream *)0x0) {
          (**(code **)(*(long *)ss.ptr_ + 8))(ss.ptr_);
          local_1a0.ptr_ = (stringstream *)0x0;
        }
      }
      else {
        if (local_221 != 0x4c) goto LAB_001886c2;
        this->outcome_ = LIVED;
      }
    }
    else if (local_221 == 0x54) {
      this->outcome_ = THREW;
    }
    else if (local_221 == 0x52) {
      this->outcome_ = RETURNED;
    }
    else {
LAB_001886c2:
      GTestLog::GTestLog((GTestLog *)local_138,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/lib/gtest/googletest/src/gtest-death-test.cc"
                         ,0x1d1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Death test child process reported ",0x22);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unexpected status byte (",0x18);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      GTestLog::~GTestLog((GTestLog *)local_138);
    }
    goto LAB_0018860e;
  }
  goto LAB_00188587;
code_r0x00188516:
  piVar4 = __errno_location();
  if (*piVar4 != 4) goto LAB_00188587;
  goto LAB_001884fd;
LAB_00188587:
  GTestLog::GTestLog((GTestLog *)&local_220,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/lib/gtest/googletest/src/gtest-death-test.cc"
                     ,0x1d6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_138[0]._M_dataplus._M_p,local_138[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
    operator_delete(local_138[0]._M_dataplus._M_p,local_138[0].field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_220);
LAB_0018860e:
  do {
    iVar2 = close(this->read_fd_);
    if (iVar2 != -1) {
      this->read_fd_ = -1;
      return;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CHECK failed: File ","");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_158);
  local_178 = (long *)*plVar5;
  plVar9 = plVar5 + 2;
  if (local_178 == plVar9) {
    local_168 = *plVar9;
    lStack_160 = plVar5[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *plVar9;
  }
  local_170 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_178);
  local_1e0 = (ulong *)*plVar5;
  puVar10 = (ulong *)(plVar5 + 2);
  if (local_1e0 == puVar10) {
    local_1d0 = *puVar10;
    lStack_1c8 = plVar5[3];
    local_1e0 = &local_1d0;
  }
  else {
    local_1d0 = *puVar10;
  }
  local_1d8 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_17c = 0x1d9;
  StreamableToString<int>(&local_1c0,&local_17c);
  uVar13 = 0xf;
  if (local_1e0 != &local_1d0) {
    uVar13 = local_1d0;
  }
  if (uVar13 < local_1c0._M_string_length + local_1d8) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      uVar14 = local_1c0.field_2._M_allocated_capacity;
    }
    if (local_1c0._M_string_length + local_1d8 <= (ulong)uVar14) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,(ulong)local_1e0);
      goto LAB_001889e5;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_1c0._M_dataplus._M_p);
LAB_001889e5:
  local_200 = (undefined8 *)*puVar8;
  puVar1 = puVar8 + 2;
  if (local_200 == puVar1) {
    local_1f0 = *puVar1;
    uStack_1e8 = puVar8[3];
    local_200 = &local_1f0;
  }
  else {
    local_1f0 = *puVar1;
  }
  local_1f8 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_200);
  local_1a0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5;
  pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar5 + 2);
  if (local_1a0.ptr_ == pbVar11) {
    local_190 = *(long *)pbVar11;
    lStack_188 = plVar5[3];
    local_1a0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190;
  }
  else {
    local_190 = *(long *)pbVar11;
  }
  local_198 = plVar5[1];
  *plVar5 = (long)pbVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  local_220._M_dataplus._M_p = (pointer)*plVar5;
  psVar12 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_220._M_dataplus._M_p == psVar12) {
    local_220.field_2._M_allocated_capacity = *psVar12;
    local_220.field_2._8_8_ = plVar5[3];
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar12;
  }
  local_220._M_string_length = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_220);
  local_138[0]._M_dataplus._M_p = (pointer)*plVar5;
  psVar12 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_138[0]._M_dataplus._M_p == psVar12) {
    local_138[0].field_2._0_8_ = *psVar12;
    local_138[0].field_2._8_8_ = plVar5[3];
    local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
  }
  else {
    local_138[0].field_2._0_8_ = *psVar12;
  }
  local_138[0]._M_string_length = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  DeathTestAbort(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_200);
  if (local_148 != (long *)0x0) {
    (**(code **)(local_148[0] + 8))(local_148);
    local_1a0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}